

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O2

void vorbis_lpc_predict(float *coeff,float *prime,int m,float *data,long n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  float fVar9;
  float afStack_18 [2];
  
  lVar4 = (long)m;
  lVar1 = (long)afStack_18 - ((lVar4 + n) * 4 + 0xfU & 0xfffffffffffffff0);
  lVar2 = 0;
  if (0 < lVar4) {
    lVar2 = lVar4;
  }
  if (prime == (float *)0x0) {
    for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
      *(undefined4 *)(lVar1 + lVar6 * 4) = 0;
    }
  }
  else {
    for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
      *(float *)(lVar1 + lVar6 * 4) = prime[lVar6];
    }
  }
  lVar6 = 0;
  if (n < 1) {
    n = lVar6;
  }
  lVar5 = lVar1;
  lVar7 = lVar2;
  for (; lVar6 != n; lVar6 = lVar6 + 1) {
    fVar9 = 0.0;
    pfVar8 = coeff + lVar4;
    for (lVar3 = 0; pfVar8 = pfVar8 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
      fVar9 = fVar9 - *pfVar8 * *(float *)(lVar5 + lVar3 * 4);
    }
    *(float *)(lVar1 + lVar7 * 4) = fVar9;
    data[lVar6] = fVar9;
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 4;
  }
  return;
}

Assistant:

void vorbis_lpc_predict(float *coeff,float *prime,int m,
                     float *data,long n){

  /* in: coeff[0...m-1] LPC coefficients
         prime[0...m-1] initial values (allocated size of n+m-1)
    out: data[0...n-1] data samples */

  long i,j,o,p;
  float y;
  float *work=alloca(sizeof(*work)*(m+n));

  if(!prime)
    for(i=0;i<m;i++)
      work[i]=0.f;
  else
    for(i=0;i<m;i++)
      work[i]=prime[i];

  for(i=0;i<n;i++){
    y=0;
    o=i;
    p=m;
    for(j=0;j<m;j++)
      y-=work[o++]*coeff[--p];

    data[i]=work[o]=y;
  }
}